

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b26d0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b26d7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b26c0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b26c8 = 0x2e2e2e2e2e2e2e;
    DAT_001b26cf = 0x2e;
    _DAT_001b26b0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b26b8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b26a0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b26a8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b2698 = 0x2e2e2e2e2e2e2e2e;
    DAT_001b26df = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }